

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_conn_cf_insert_after(Curl_cfilter *cf_at,Curl_cfilter *cf_new)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter **ppCVar2;
  Curl_cfilter **pnext;
  Curl_cfilter *tail;
  Curl_cfilter *cf_new_local;
  Curl_cfilter *cf_at_local;
  
  pCVar1 = cf_at->next;
  cf_at->next = cf_new;
  tail = cf_new;
  do {
    tail->conn = cf_at->conn;
    tail->sockindex = cf_at->sockindex;
    ppCVar2 = &tail->next;
    tail = tail->next;
  } while (tail != (Curl_cfilter *)0x0);
  *ppCVar2 = pCVar1;
  return;
}

Assistant:

void Curl_conn_cf_insert_after(struct Curl_cfilter *cf_at,
                               struct Curl_cfilter *cf_new)
{
  struct Curl_cfilter *tail, **pnext;

  DEBUGASSERT(cf_at);
  DEBUGASSERT(cf_new);
  DEBUGASSERT(!cf_new->conn);

  tail = cf_at->next;
  cf_at->next = cf_new;
  do {
    cf_new->conn = cf_at->conn;
    cf_new->sockindex = cf_at->sockindex;
    pnext = &cf_new->next;
    cf_new = cf_new->next;
  } while(cf_new);
  *pnext = tail;
}